

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_md5.h
# Opt level: O0

string * __thiscall
psql::bytes_to_hex_abi_cxx11_(string *__return_storage_ptr__,psql *this,uint8_t *b)

{
  undefined4 local_20;
  int q;
  uint8_t *b_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_20 = 0; local_20 < 0x10; local_20 = local_20 + 1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string
bytes_to_hex(std::uint8_t b[16])
{
	std::string s;
	static const char *hex = "0123456789abcdef";
	for (int q = 0; q < 16; q++)
	{
		s.push_back(char(hex[(b[q] >> 4) & 0x0F]));
		s.push_back(char(hex[b[q] & 0x0F]));
	}
	return s;
}